

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

int Gia_ObjCheckTfi(Gia_Man_t *p,Gia_Obj_t *pOld,Gia_Obj_t *pNode)

{
  ulong *puVar1;
  int iVar2;
  Vec_Ptr_t *vVisited;
  void **ppvVar3;
  long lVar4;
  
  if (((ulong)pOld & 1) != 0) {
    __assert_fail("!Gia_IsComplement(pOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                  ,0x71d,"int Gia_ObjCheckTfi(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  if (((ulong)pNode & 1) == 0) {
    vVisited = (Vec_Ptr_t *)malloc(0x10);
    vVisited->nCap = 100;
    vVisited->nSize = 0;
    ppvVar3 = (void **)malloc(800);
    vVisited->pArray = ppvVar3;
    iVar2 = Gia_ObjCheckTfi_rec(p,pOld,pNode,vVisited);
    for (lVar4 = 0; lVar4 < vVisited->nSize; lVar4 = lVar4 + 1) {
      puVar1 = (ulong *)vVisited->pArray[lVar4];
      *puVar1 = *puVar1 & 0xffffffffbfffffff;
    }
    free(vVisited->pArray);
    free(vVisited);
    return iVar2;
  }
  __assert_fail("!Gia_IsComplement(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                ,0x71e,"int Gia_ObjCheckTfi(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
}

Assistant:

int Gia_ObjCheckTfi( Gia_Man_t * p, Gia_Obj_t * pOld, Gia_Obj_t * pNode )
{
    Vec_Ptr_t * vVisited;
    Gia_Obj_t * pObj;
    int RetValue, i;
    assert( !Gia_IsComplement(pOld) );
    assert( !Gia_IsComplement(pNode) );
    vVisited = Vec_PtrAlloc( 100 );
    RetValue = Gia_ObjCheckTfi_rec( p, pOld, pNode, vVisited );
    Vec_PtrForEachEntry( Gia_Obj_t *, vVisited, pObj, i )
        pObj->fMark0 = 0;
    Vec_PtrFree( vVisited );
    return RetValue;
}